

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_issue_preface(lws *wsi)

{
  lws_h2_netconn *plVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  lws_h2_protocol_send *pps_00;
  lws_h2_protocol_send *pps;
  lws_h2_netconn *h2n;
  lws *wsi_local;
  
  plVar1 = (wsi->h2).h2n;
  if (plVar1 == (lws_h2_netconn *)0x0) {
    _lws_log(2,"%s: no valid h2n\n","lws_h2_issue_preface");
    wsi_local._4_4_ = 1;
  }
  else if ((*(ushort *)&plVar1->field_0xa8 >> 0xb & 1) == 0) {
    pcVar3 = lws_wsi_tag(wsi);
    _lws_log(0x10,"%s: %s: fd %d\n","lws_h2_issue_preface",pcVar3,(ulong)(uint)(wsi->desc).sockfd);
    pcVar3 = preface;
    sVar4 = strlen(preface);
    iVar2 = lws_issue_raw(wsi,(uchar *)pcVar3,sVar4);
    sVar4 = strlen(preface);
    if (iVar2 == (int)sVar4) {
      *(ushort *)&plVar1->field_0xa8 = *(ushort *)&plVar1->field_0xa8 & 0xf7ff | 0x800;
      lws_role_transition(wsi,0x10000000,LRS_H2_WAITING_TO_SEND_HEADERS,&role_ops_h2);
      plVar1->count = 0;
      (wsi->txc).tx_cr = 0xffff;
      pps_00 = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
      if (pps_00 == (lws_h2_protocol_send *)0x0) {
        wsi_local._4_4_ = 1;
      }
      else {
        lws_pps_schedule(wsi,pps_00);
        _lws_log(8,"%s: h2 client sending settings\n","lws_h2_issue_preface");
        wsi_local._4_4_ = 0;
      }
    }
    else {
      wsi_local._4_4_ = 1;
    }
  }
  else {
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_h2_issue_preface(struct lws *wsi)
{
	struct lws_h2_netconn *h2n = wsi->h2.h2n;
	struct lws_h2_protocol_send *pps;

	if (!h2n) {
		lwsl_warn("%s: no valid h2n\n", __func__);
		return 1;
	}

	if (h2n->sent_preface)
		return 1;

	lwsl_debug("%s: %s: fd %d\n", __func__, lws_wsi_tag(wsi), (int)wsi->desc.sockfd);

	if (lws_issue_raw(wsi, (uint8_t *)preface, strlen(preface)) !=
		(int)strlen(preface))
		return 1;

	h2n->sent_preface = 1;

	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_H2_WAITING_TO_SEND_HEADERS,
			    &role_ops_h2);

	h2n->count = 0;
	wsi->txc.tx_cr = 65535;

	/*
	 * we must send a settings frame
	 */
	pps = lws_h2_new_pps(LWS_H2_PPS_MY_SETTINGS);
	if (!pps)
		return 1;
	lws_pps_schedule(wsi, pps);
	lwsl_info("%s: h2 client sending settings\n", __func__);

	return 0;
}